

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O0

void up_heap(priority_queue *qp,size_t i)

{
  anon_union_8_2_94730108_for_payload aVar1;
  undefined4 uVar2;
  wchar_t wVar3;
  undefined4 uVar4;
  ulong uVar5;
  priority_queue_element *ppVar6;
  priority_queue_element *ppVar7;
  priority_queue_element tmp;
  size_t parent;
  size_t i_local;
  priority_queue *qp_local;
  
  parent = i;
  while ((parent != 0 &&
         (uVar5 = parent - 1 >> 1, qp->data[parent].priority < qp->data[uVar5].priority))) {
    ppVar6 = qp->data + uVar5;
    aVar1 = ppVar6->payload;
    wVar3 = ppVar6->priority;
    uVar4 = *(undefined4 *)&ppVar6->field_0xc;
    ppVar6 = qp->data + uVar5;
    ppVar7 = qp->data + parent;
    ppVar6->payload = ppVar7->payload;
    uVar2 = *(undefined4 *)&ppVar7->field_0xc;
    ppVar6->priority = ppVar7->priority;
    *(undefined4 *)&ppVar6->field_0xc = uVar2;
    ppVar6 = qp->data + parent;
    ppVar6->payload = aVar1;
    ppVar6->priority = wVar3;
    *(undefined4 *)&ppVar6->field_0xc = uVar4;
    parent = uVar5;
  }
  return;
}

Assistant:

static void up_heap(struct priority_queue *qp, size_t i)
{
	while (1) {
		size_t parent;
		struct priority_queue_element tmp;

		if (i == 0) {
			break;
		}
		parent = (i - 1) >> 1;
		if (qp->data[i].priority >= qp->data[parent].priority) {
			break;
		}
		tmp = qp->data[parent];
		qp->data[parent] = qp->data[i];
		qp->data[i] = tmp;
		i = parent;
	}
}